

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

bool libtorrent::aux::anon_unknown_135::connecting_time_compare
               (peer_connection *lhs,peer_connection *rhs)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  bool bVar4;
  
  bVar2 = 0;
  bVar1 = 0;
  if (((lhs->super_peer_connection_hot_members).field_0x28 & 2) != 0) {
    iVar3 = (*(lhs->super_bandwidth_socket)._vptr_bandwidth_socket[1])(lhs);
    bVar1 = (byte)iVar3 ^ 1;
  }
  if (((rhs->super_peer_connection_hot_members).field_0x28 & 2) != 0) {
    iVar3 = (*(rhs->super_bandwidth_socket)._vptr_bandwidth_socket[1])(rhs);
    bVar2 = (byte)iVar3 ^ 1;
  }
  bVar4 = bVar1 < bVar2;
  if (bVar1 == bVar2) {
    bVar4 = (rhs->m_connect).__d.__r < (lhs->m_connect).__d.__r;
  }
  return bVar4;
}

Assistant:

bool connecting_time_compare(peer_connection const* lhs, peer_connection const* rhs)
	{
		bool const lhs_connecting = lhs->is_connecting() && !lhs->is_disconnecting();
		bool const rhs_connecting = rhs->is_connecting() && !rhs->is_disconnecting();
		if (lhs_connecting != rhs_connecting) return (int(lhs_connecting) < int(rhs_connecting));

		// a lower value of connected_time means it's been waiting
		// longer. This is a less-than comparison, so if lhs has
		// waited longer than rhs, we should return false.
		return lhs->connected_time() > rhs->connected_time();
	}